

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall
Hospital::Id_Validate_for_fire
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  pointer pNVar5;
  long lVar6;
  char *pcVar7;
  Hospital *this_00;
  string id_1;
  string local_98 [2];
  vector<Nurse,_std::allocator<Nurse>_> local_58;
  pointer local_40;
  pointer local_38;
  _Alloc_hider local_30;
  
  this_00 = (Hospital *)local_98;
  if (id->_M_string_length == 8) {
    pcVar2 = (id->_M_dataplus)._M_p;
    local_40 = (pointer)&stack0xffffffffffffffd0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar2,pcVar2 + 8);
    bVar3 = true;
    if (local_38 != (pointer)0x0) {
      cVar1 = *(char *)&(local_40->super_Human).Id._M_dataplus._M_p;
      if ((byte)(cVar1 - 0x30U) < 10) {
        pNVar5 = (pointer)0x0;
        do {
          if (cVar1 == '0') goto LAB_0011dcb5;
          if ((pointer)((long)&local_38[-1].nurse_all_ino.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7U) == pNVar5)
          goto LAB_0011dcb7;
          pcVar7 = (undefined1 *)((long)&(local_40->super_Human).Id._M_dataplus._M_p + 1) +
                   (long)pNVar5;
          pNVar5 = (pointer)((long)&(pNVar5->super_Human).Id._M_dataplus._M_p + 1);
        } while ((byte)(*pcVar7 - 0x30U) < 10);
        bVar3 = local_38 <= pNVar5;
      }
      else {
LAB_0011dcb5:
        bVar3 = false;
      }
    }
LAB_0011dcb7:
    if (local_40 != (pointer)&stack0xffffffffffffffd0) {
      operator_delete(local_40,(ulong)(local_30._M_p + 1));
    }
    if (bVar3) {
      std::vector<Nurse,_std::allocator<Nurse>_>::vector(&local_58,All_Of_Nurses);
      pcVar2 = (id->_M_dataplus)._M_p;
      local_98[0]._M_dataplus._M_p = (pointer)&local_98[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar2,pcVar2 + id->_M_string_length);
      bVar3 = Existence_Of_Id_For_Nurses(this_00,&local_58,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
        operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
      }
      std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_58);
      if (bVar3) {
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar4 = psVar4 + 0x10;
        pcVar2 = (id->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar4,pcVar2,pcVar2 + id->_M_string_length);
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      lVar6 = 0x1e;
      pcVar7 = "This id already not exists !!!";
    }
    else {
      lVar6 = 0x21;
      pcVar7 = "Your id must consist of numbers !";
    }
  }
  else {
    lVar6 = 0x23;
    pcVar7 = "Your id lenght must be equal to 8 !";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return false;
}

Assistant:

bool Hospital :: Id_Validate_for_fire(vector<Nurse> All_Of_Nurses,string id){
    try {
        if(id.length() != 8) {
            cout <<"Your id lenght must be equal to 8 !"<<endl;
            return false;
        }
        else if(!validate_String_Must_Be_Number(id)) {
            cout <<"Your id must consist of numbers !"<<endl;
            return false;
        }
        else if(! Existence_Of_Id_For_Nurses(All_Of_Nurses ,id)){
            cout << "This id already not exists !!!"<<endl;   ///add bool func to search in file and check existence of id
            return false;
        }
        else throw id;
    }
    catch(string id) {
        cout << "your id entered successfully ."<<endl;
        return true;
    }
}